

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border_offset.cpp
# Opt level: O2

size_t cppurses::detail::Border_offset::north(Widget *w)

{
  if (((w->border).enabled_ == true) && (1 < w->outer_height_)) {
    if ((w->border).segments.north.enabled_ != false) {
      return 1;
    }
    if ((w->border).segments.north_east.enabled_ != false) {
      return 1;
    }
    if ((w->border).segments.north_west.enabled_ != false) {
      return 1;
    }
  }
  return 0;
}

Assistant:

std::size_t Border_offset::north(const Widget& w) {
    const auto& b = w.border.segments;
    if (w.border.enabled() && !north_disqualified(w) &&
        (b.north.enabled() || b.north_east.enabled() ||
         b.north_west.enabled())) {
        return 1;
    }
    return 0;
}